

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QRect __thiscall
QPixmapStyle::scrollBarSubControlRect
          (QPixmapStyle *this,QStyleOptionComplex *option,SubControl sc,QWidget *param_4)

{
  QRect QVar1;
  QStyleOptionSlider *pQVar2;
  int in_EDX;
  QStyleOption *in_RSI;
  long in_FS_OFFSET;
  int pos;
  int page;
  QStyleOptionSlider *slider;
  int length;
  QRect rect;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QRect *in_stack_ffffffffffffff90;
  int local_54;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RSI);
  if (pQVar2 != (QStyleOptionSlider *)0x0) {
    if (pQVar2->orientation == Horizontal) {
      local_54 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                             );
    }
    else {
      local_54 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ));
    }
    local_1c = local_54;
    local_20 = (local_54 * pQVar2->sliderValue) /
               ((pQVar2->maximum - pQVar2->minimum) + pQVar2->pageStep) +
               (local_54 * pQVar2->pageStep) /
               ((pQVar2->maximum - pQVar2->minimum) + pQVar2->pageStep);
    qMin<int>(&local_20,&local_1c);
    local_18._0_4_ = (pQVar2->super_QStyleOptionComplex).super_QStyleOption.rect.x1;
    local_18._4_4_ = (pQVar2->super_QStyleOptionComplex).super_QStyleOption.rect.y1;
    local_10._0_4_ = (pQVar2->super_QStyleOptionComplex).super_QStyleOption.rect.x2;
    local_10._4_4_ = (pQVar2->super_QStyleOptionComplex).super_QStyleOption.rect.y2;
    if (pQVar2->orientation == Horizontal) {
      if (in_EDX == 4) {
        QRect::setLeft(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
      if (in_EDX == 8) {
        QRect::setRight(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
      if (in_EDX == 0x40) {
        QRect::setLeft(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        QRect::setRight(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
    }
    else {
      if (in_EDX == 4) {
        QRect::setTop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
      if (in_EDX == 8) {
        QRect::setBottom(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
      if (in_EDX == 0x40) {
        QRect::setTop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        QRect::setBottom(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        goto LAB_00401e7c;
      }
    }
    if (in_EDX == 0x80) goto LAB_00401e7c;
  }
  QRect::QRect(in_stack_ffffffffffffff90);
LAB_00401e7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.x2.m_i = (undefined4)local_10;
  QVar1.y2.m_i = local_10._4_4_;
  QVar1.x1.m_i = (undefined4)local_18;
  QVar1.y1.m_i = local_18._4_4_;
  return QVar1;
}

Assistant:

QRect QPixmapStyle::scrollBarSubControlRect(const QStyleOptionComplex *option,
                                            QStyle::SubControl sc, const QWidget *) const
{
#if QT_CONFIG(slider)
    if (const QStyleOptionSlider *slider =
                qstyleoption_cast<const QStyleOptionSlider*>(option)) {
        int length = (slider->orientation == Qt::Horizontal)
                ? slider->rect.width() : slider->rect.height();
        int page = length * slider->pageStep
                / (slider->maximum - slider->minimum + slider->pageStep);
        int pos = length * slider->sliderValue
                / (slider->maximum - slider->minimum + slider->pageStep);
        pos = qMin(pos+page, length) - page;

        QRect rect = slider->rect;

        if (slider->orientation == Qt::Horizontal) {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setLeft(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setRight(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setLeft(pos);
                rect.setRight(pos+page);
                return rect;
            default: ;
            }
        } else {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setTop(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setBottom(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setTop(pos);
                rect.setBottom(pos+page);
                return rect;
            default: ;
            }
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(sc);
#endif // QT_CONFIG(slider)
    return QRect();
}